

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

int stb_fcmp(char *s1,char *s2)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  FILE *__stream_00;
  
  __stream = fopen(s1,"rb");
  __stream_00 = fopen(s2,"rb");
  if (__stream == (FILE *)0x0 || __stream_00 == (FILE *)0x0) {
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    if (__stream_00 == (FILE *)0x0) {
      uVar2 = (uint)(__stream != (FILE *)0x0);
    }
    else {
      fclose(__stream_00);
      uVar2 = 1;
    }
    return uVar2;
  }
  iVar1 = stb_fcmp_core((FILE *)__stream,(FILE *)__stream_00);
  return iVar1;
}

Assistant:

int stb_fcmp(char *s1, char *s2)
{
   FILE *f = stb__fopen(s1, "rb");
   FILE *g = stb__fopen(s2, "rb");

   if (f == NULL || g == NULL) {
      if (f) fclose(f);
      if (g) {
         fclose(g);
         return STB_TRUE;
      }
      return f != NULL;
   }

   return stb_fcmp_core(f,g);
}